

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixderiv.h
# Opt level: O0

double __thiscall
MixDerivs<double>::d2psir_dxidxj__consttaudelta(MixDerivs<double> *this,size_t i,size_t j)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar8;
  size_t j_local;
  size_t i_local;
  MixDerivs<double> *this_local;
  
  dVar1 = this->delta;
  dVar2 = this->R;
  dVar3 = this->tau;
  dVar5 = Ar(this,0,0);
  dVar6 = d2rhorTr_dxidxj__consttaudelta(this,i,j);
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0x16])(this->m_ders,i);
  dVar7 = drhorTr_dxi__xj(this,j);
  dVar4 = this->rhorTr;
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0x19])(this->m_ders,i,j);
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0x16])(this->m_ders,j);
  dVar8 = drhorTr_dxi__xj(this,i);
  return ((dVar1 * dVar2) / dVar3) *
         (extraout_XMM0_Qa_01 * dVar8 +
         dVar4 * extraout_XMM0_Qa_00 + dVar5 * dVar6 + extraout_XMM0_Qa * dVar7);
}

Assistant:

TYPE d2psir_dxidxj__consttaudelta(std::size_t i, std::size_t j) const {
        return delta*R / tau*(Ar(0, 0)*d2rhorTr_dxidxj__consttaudelta(i, j)
            + m_ders.dalphar_dxi__taudeltaxj(i)*drhorTr_dxi__xj(j)
            + rhorTr*m_ders.d2alphar_dxidxj__consttaudelta(i, j)
            + m_ders.dalphar_dxi__taudeltaxj(j)*drhorTr_dxi__xj(i)
            );
    }